

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

PoolingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_pooling(NeuralNetworkLayer *this)

{
  bool bVar1;
  PoolingLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_pooling(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_pooling(this);
    this_00 = (PoolingLayerParams *)operator_new(0x58);
    PoolingLayerParams::PoolingLayerParams(this_00);
    (this->layer_).pooling_ = this_00;
  }
  return (PoolingLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::PoolingLayerParams* NeuralNetworkLayer::mutable_pooling() {
  if (!has_pooling()) {
    clear_layer();
    set_has_pooling();
    layer_.pooling_ = new ::CoreML::Specification::PoolingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.pooling)
  return layer_.pooling_;
}